

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

void sexp_set_twos_complement(sexp_conflict a)

{
  ulong uVar1;
  int iVar2;
  bool local_29;
  sexp_uint_t n;
  sexp_uint_t *data;
  int carry;
  int len;
  int i;
  sexp_conflict a_local;
  
  iVar2 = (int)(a->value).fileno.fd;
  carry = 1;
  i = iVar2;
  while (i = i + -1, -1 < i) {
    *(ulong *)((long)&a->value + (long)i * 8 + 0x10) =
         *(ulong *)((long)&a->value + (long)i * 8 + 0x10) ^ 0xffffffffffffffff;
  }
  i = 0;
  do {
    uVar1 = *(ulong *)((long)&a->value + (long)i * 8 + 0x10);
    *(long *)((long)&a->value + (long)i * 8 + 0x10) =
         (long)carry + *(long *)((long)&a->value + (long)i * 8 + 0x10);
    carry = (int)(-(long)carry - 1U < uVar1);
    i = i + 1;
    local_29 = i < iVar2 && carry != 0;
  } while (local_29);
  return;
}

Assistant:

static void sexp_set_twos_complement (sexp a) {
  int i, len=sexp_bignum_length(a), carry = 1;
  sexp_uint_t* data = sexp_bignum_data(a), n;
  for (i=len-1; i >=0; --i)
    data[i] = ~data[i];
  /* sexp_bignum_fxadd with no final carry */
  i = 0;
  do { n = data[i];
       data[i] += carry;
       carry = (n > (SEXP_UINT_T_MAX - carry));
  } while (++i<len && carry);
}